

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int add_attr(attr_list list,atom_t attr_id,attr_value_type val_type,attr_value val)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  undefined8 in_RCX;
  long lVar4;
  int in_EDX;
  undefined4 uVar5;
  int in_ESI;
  long in_RDI;
  int count_1;
  int size;
  int count;
  attr_union value;
  int i;
  undefined8 local_30;
  undefined8 local_28;
  uint local_1c;
  
  uVar5 = (undefined4)in_RCX;
  switch(in_EDX) {
  case 0:
    break;
  case 2:
    local_30 = in_RCX;
  case 1:
  case 5:
    local_30 = CONCAT44(local_30._4_4_,uVar5);
    break;
  case 3:
  case 6:
    local_30 = in_RCX;
    break;
  case 4:
    local_28 = CONCAT44(in_ESI,in_EDX);
    local_30 = in_RCX;
    break;
  case 7:
  case 8:
    local_30 = in_RCX;
    break;
  case 9:
    local_30 = CONCAT44(local_30._4_4_,uVar5);
  }
  if (in_EDX == 1) {
    uVar1 = (uint)*(byte *)(*(long *)(in_RDI + 0x10) + 1);
    if (uVar1 != 0) {
      pvVar2 = realloc(*(void **)(in_RDI + 0x10),(long)(int)((uVar1 + 1) * 8 + 0xc));
      *(void **)(in_RDI + 0x10) = pvVar2;
    }
    while ((local_1c = uVar1 - 1, -1 < (int)local_1c &&
           (in_ESI < *(int *)(*(long *)(in_RDI + 0x10) + 4 + (long)(int)local_1c * 8)))) {
      *(undefined4 *)(*(long *)(in_RDI + 0x10) + 4 + (long)(int)uVar1 * 8) =
           *(undefined4 *)(*(long *)(in_RDI + 0x10) + 4 + (long)(int)local_1c * 8);
      *(undefined4 *)(*(long *)(in_RDI + 0x10) + 8 + (long)(int)uVar1 * 8) =
           *(undefined4 *)(*(long *)(in_RDI + 0x10) + 8 + (long)(int)local_1c * 8);
      uVar1 = local_1c;
    }
    *(int *)(*(long *)(in_RDI + 0x10) + 4 + (long)(int)uVar1 * 8) = in_ESI;
    *(undefined4 *)(*(long *)(in_RDI + 0x10) + 8 + (long)(int)uVar1 * 8) = uVar5;
    *(char *)(*(long *)(in_RDI + 0x10) + 1) = *(char *)(*(long *)(in_RDI + 0x10) + 1) + '\x01';
  }
  else {
    uVar1 = (uint)*(byte *)(*(long *)(in_RDI + 0x10) + 2);
    if (uVar1 == 0) {
      pvVar2 = malloc(0x18);
      *(void **)(in_RDI + 8) = pvVar2;
    }
    else {
      pvVar2 = realloc(*(void **)(in_RDI + 8),(long)(int)(uVar1 + 1) * 0x18);
      *(void **)(in_RDI + 8) = pvVar2;
    }
    while ((local_1c = uVar1 - 1, -1 < (int)local_1c &&
           (in_ESI < *(int *)(*(long *)(in_RDI + 8) + (long)(int)local_1c * 0x18)))) {
      *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)uVar1 * 0x18) =
           *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)local_1c * 0x18);
      *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)uVar1 * 0x18 + 4) =
           *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)local_1c * 0x18 + 4);
      lVar3 = *(long *)(in_RDI + 8) + (long)(int)uVar1 * 0x18;
      lVar4 = *(long *)(in_RDI + 8) + (long)(int)local_1c * 0x18;
      *(undefined8 *)(lVar3 + 8) = *(undefined8 *)(lVar4 + 8);
      *(undefined8 *)(lVar3 + 0x10) = *(undefined8 *)(lVar4 + 0x10);
      uVar1 = local_1c;
    }
    *(int *)(*(long *)(in_RDI + 8) + (long)(int)uVar1 * 0x18) = in_ESI;
    *(int *)(*(long *)(in_RDI + 8) + (long)(int)uVar1 * 0x18 + 4) = in_EDX;
    lVar3 = *(long *)(in_RDI + 8) + (long)(int)uVar1 * 0x18;
    *(undefined8 *)(lVar3 + 8) = local_30;
    *(undefined8 *)(lVar3 + 0x10) = local_28;
    *(char *)(*(long *)(in_RDI + 0x10) + 2) = *(char *)(*(long *)(in_RDI + 0x10) + 2) + '\x01';
  }
  return 1;
}

Assistant:

extern int
add_attr(attr_list list, atom_t attr_id, attr_value_type val_type, attr_value val)
{
    int i;
    attr_union value;
    switch(val_type) {
    case Attr_Int8:
	if (sizeof(long) == 8) {
	    value.u.l = (long) val;
	}
    case Attr_Int4:
    case Attr_Atom:
      if (sizeof(int) == 4) {
	  value.u.i = (long)val;
      }
      break;
    case Attr_Float16:
	if (sizeof(double) == 16) {
	    value.u.d = *(double*)&val;
	    break;
	}
    case Attr_Float8:
	if (sizeof(double) == 8) {
	    value.u.d = *(double*)&val;
	    break;
	} else if (sizeof(float) == 8) {
	    value.u.f = *(float*)&val;
	    break;
	}
    case Attr_Float4:
	if (sizeof(double) == 4) {
	    value.u.d = *(double*)&val;
	    break;
	} else if (sizeof(float) == 4) {
	    value.u.f = *(float*)&val;
	    break;
	}
    case Attr_Opaque:
	value.u.o = *(attr_opaque_p)&val;
	break;
    case Attr_String:
    case Attr_List:
	value.u.p = (void*)val;
	break;
    case Attr_Undefined:
	break;
    }
    if (val_type == Attr_Int4) {
	int count = list->l.list.iattrs->int_attr_count;
	if (count > 0) {
	    int size = sizeof(struct int_attr_struct) + 
		(count+1)* sizeof(int_attr);
	    list->l.list.iattrs = realloc(list->l.list.iattrs, size);
	}
	
	for (i = count - 1; i >= 0; i--) {
	    if (list->l.list.iattrs->iattr[i].attr_id > attr_id) {
		list->l.list.iattrs->iattr[i+1].attr_id = list->l.list.iattrs->iattr[i].attr_id;
		list->l.list.iattrs->iattr[i+1].value = list->l.list.iattrs->iattr[i].value;
	    } else {
		break;
	    }
	}
	
	list->l.list.iattrs->iattr[i+1].attr_id = attr_id;
	list->l.list.iattrs->iattr[i+1].value = (int4) (long) val;
	list->l.list.iattrs->int_attr_count++;
    } else {
	int count = list->l.list.iattrs->other_attr_count;
	if (count == 0) {
	    list->l.list.attributes = (attr_p) malloc(sizeof(attr));
	} else {	    
	    list->l.list.attributes = (attr_p) realloc(list->l.list.attributes,
						       sizeof(attr)*(count+1));
	}
	
	for (i = count - 1; i >= 0; i--) {
	    if (list->l.list.attributes[i].attr_id > attr_id) {
		list->l.list.attributes[i+1].attr_id = list->l.list.attributes[i].attr_id;
		list->l.list.attributes[i+1].val_type = list->l.list.attributes[i].val_type;
		list->l.list.attributes[i+1].value = list->l.list.attributes[i].value;
	    } else {
		break;
	    }
	}
	
	list->l.list.attributes[i+1].attr_id = attr_id;
	list->l.list.attributes[i+1].val_type = val_type;
	list->l.list.attributes[i+1].value = value;
	list->l.list.iattrs->other_attr_count++;
    }
    return 1;
}